

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BitvecSet(Bitvec *p,u32 i)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Bitvec *pBVar5;
  sqlite3 *db;
  uint uVar6;
  int in_ESI;
  uint *in_RDI;
  u32 *aiValues;
  int rc;
  uint j;
  u32 bin;
  u32 h;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar7;
  u64 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint local_20;
  uint in_stack_ffffffffffffffe4;
  uint *local_10;
  
  if (in_RDI == (uint *)0x0) {
    return 0;
  }
  uVar2 = in_ESI - 1;
  local_10 = in_RDI;
  while( true ) {
    uVar7 = false;
    if (0xf80 < *local_10) {
      uVar7 = local_10[2] != 0;
    }
    if ((bool)uVar7 == false) break;
    in_stack_ffffffffffffffe4 = uVar2 / local_10[2];
    uVar2 = uVar2 % local_10[2];
    if (*(long *)(local_10 + (ulong)in_stack_ffffffffffffffe4 * 2 + 4) == 0) {
      pBVar5 = sqlite3BitvecCreate((u32)(in_stack_ffffffffffffffd0 >> 0x20));
      *(Bitvec **)(local_10 + (ulong)in_stack_ffffffffffffffe4 * 2 + 4) = pBVar5;
      if (*(long *)(local_10 + (ulong)in_stack_ffffffffffffffe4 * 2 + 4) == 0) {
        return 7;
      }
    }
    local_10 = *(uint **)(local_10 + (ulong)in_stack_ffffffffffffffe4 * 2 + 4);
  }
  if (*local_10 < 0xf81) {
    *(byte *)((long)local_10 + (ulong)(uVar2 >> 3) + 0x10) =
         *(byte *)((long)local_10 + (ulong)(uVar2 >> 3) + 0x10) | (byte)(1 << ((byte)uVar2 & 7));
    return 0;
  }
  uVar6 = uVar2 + 1;
  uVar2 = uVar2 % 0x7c;
  if (local_10[(ulong)uVar2 + 4] == 0) {
    if (local_10[1] < 0x7b) goto LAB_0015d1b6;
  }
  else {
    do {
      if (local_10[(ulong)uVar2 + 4] == uVar6) {
        return 0;
      }
      uVar2 = uVar2 + 1;
      if (0x7b < uVar2) {
        uVar2 = 0;
      }
    } while (local_10[(ulong)uVar2 + 4] != 0);
  }
  if (0x3d < local_10[1]) {
    db = (sqlite3 *)
         sqlite3DbMallocRaw((sqlite3 *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd0);
    if (db == (sqlite3 *)0x0) {
      return 7;
    }
    memcpy(db,local_10 + 4,0x1f0);
    memset(local_10 + 4,0,0x1f0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)*local_10 + 0x3d;
    local_10[2] = SUB164(auVar1 / ZEXT816(0x3e),0);
    uVar3 = sqlite3BitvecSet((Bitvec *)CONCAT44(uVar6,uVar2),in_stack_ffffffffffffffe4);
    for (local_20 = 0; local_20 < 0x7c; local_20 = local_20 + 1) {
      if (*(int *)((long)&db->pVfs + (ulong)local_20 * 4) != 0) {
        uVar4 = sqlite3BitvecSet((Bitvec *)CONCAT44(uVar6,uVar2),in_stack_ffffffffffffffe4);
        uVar3 = uVar4 | uVar3;
      }
    }
    sqlite3DbFree(db,(void *)CONCAT17(uVar7,in_stack_ffffffffffffffc8));
    return uVar3;
  }
LAB_0015d1b6:
  local_10[1] = local_10[1] + 1;
  local_10[(ulong)uVar2 + 4] = uVar6;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BitvecSet(Bitvec *p, u32 i){
  u32 h;
  if( p==0 ) return SQLITE_OK;
  assert( i>0 );
  assert( i<=p->iSize );
  i--;
  while((p->iSize > BITVEC_NBIT) && p->iDivisor) {
    u32 bin = i/p->iDivisor;
    i = i%p->iDivisor;
    if( p->u.apSub[bin]==0 ){
      p->u.apSub[bin] = sqlite3BitvecCreate( p->iDivisor );
      if( p->u.apSub[bin]==0 ) return SQLITE_NOMEM_BKPT;
    }
    p = p->u.apSub[bin];
  }
  if( p->iSize<=BITVEC_NBIT ){
    p->u.aBitmap[i/BITVEC_SZELEM] |= 1 << (i&(BITVEC_SZELEM-1));
    return SQLITE_OK;
  }
  h = BITVEC_HASH(i++);
  /* if there wasn't a hash collision, and this doesn't */
  /* completely fill the hash, then just add it without */
  /* worrying about sub-dividing and re-hashing. */
  if( !p->u.aHash[h] ){
    if (p->nSet<(BITVEC_NINT-1)) {
      goto bitvec_set_end;
    } else {
      goto bitvec_set_rehash;
    }
  }
  /* there was a collision, check to see if it's already */
  /* in hash, if not, try to find a spot for it */
  do {
    if( p->u.aHash[h]==i ) return SQLITE_OK;
    h++;
    if( h>=BITVEC_NINT ) h = 0;
  } while( p->u.aHash[h] );
  /* we didn't find it in the hash.  h points to the first */
  /* available free spot. check to see if this is going to */
  /* make our hash too "full".  */
bitvec_set_rehash:
  if( p->nSet>=BITVEC_MXHASH ){
    unsigned int j;
    int rc;
    u32 *aiValues = sqlite3StackAllocRaw(0, sizeof(p->u.aHash));
    if( aiValues==0 ){
      return SQLITE_NOMEM_BKPT;
    }else{
      memcpy(aiValues, p->u.aHash, sizeof(p->u.aHash));
      memset(p->u.apSub, 0, sizeof(p->u.apSub));
      p->iDivisor = (p->iSize + BITVEC_NPTR - 1)/BITVEC_NPTR;
      rc = sqlite3BitvecSet(p, i);
      for(j=0; j<BITVEC_NINT; j++){
        if( aiValues[j] ) rc |= sqlite3BitvecSet(p, aiValues[j]);
      }
      sqlite3StackFree(0, aiValues);
      return rc;
    }
  }
bitvec_set_end:
  p->nSet++;
  p->u.aHash[h] = i;
  return SQLITE_OK;
}